

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall
LLVMBC::ModuleParseContext::parse_function_child_block
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  pointer pBVar1;
  bool bVar2;
  BlockOrRecord *child;
  pointer pBVar3;
  bool bVar4;
  
  if (entry->id == 0x10) {
    pBVar3 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar4 = pBVar3 == pBVar1;
      if (bVar4) {
        return bVar4;
      }
      bVar2 = parse_metadata_attachment_record(this,pBVar3);
      pBVar3 = pBVar3 + 1;
    } while (bVar2);
  }
  else {
    bVar4 = true;
    if (entry->id == 0xb) {
      pBVar3 = (entry->children).
               super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar1 = (entry->children).
               super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        bVar4 = pBVar3 == pBVar1;
        if (bVar4) {
          return bVar4;
        }
        bVar2 = parse_constants_record(this,pBVar3);
        pBVar3 = pBVar3 + 1;
      } while (bVar2);
    }
  }
  return bVar4;
}

Assistant:

bool ModuleParseContext::parse_function_child_block(const BlockOrRecord &entry)
{
	switch (KnownBlocks(entry.id))
	{
	case KnownBlocks::CONSTANTS_BLOCK:
	{
		for (auto &child : entry.children)
			if (!parse_constants_record(child))
				return false;
		break;
	}

	case KnownBlocks::METADATA_ATTACHMENT:
	{
		for (auto &child : entry.children)
			if (!parse_metadata_attachment_record(child))
				return false;
		break;
	}

	default:
		break;
	}

	return true;
}